

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O2

FiniteAutomaton *
Omega_h::FiniteAutomaton::make_deterministic
          (FiniteAutomaton *__return_storage_ptr__,FiniteAutomaton *nfa)

{
  _Rb_tree_node_base *p_Var1;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  mapped_type *pmVar6;
  reference pvVar7;
  _Base_ptr p_Var8;
  iterator iVar9;
  int i;
  StateSetUniqPtrVector ssupv;
  StateSet next_ss;
  StateSetPtr2State ssp2s;
  StateSet start_ss;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_c0 [6];
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  if (nfa->is_deterministic == true) {
    FiniteAutomaton(__return_storage_ptr__,nfa);
  }
  else {
    ssp2s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &ssp2s._M_t._M_impl.super__Rb_tree_header._M_header;
    ssp2s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    ssp2s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    ssp2s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    ssupv.
    super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ssupv.
    super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ssupv.
    super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ssp2s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         ssp2s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    FiniteAutomaton(__return_storage_ptr__,(nfa->table).ncols + -2,true,0);
    start_ss._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &start_ss._M_t._M_impl.super__Rb_tree_header._M_header;
    start_ss._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    start_ss._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    start_ss._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    next_ss._M_t._M_impl._0_8_ = (ulong)(uint)next_ss._M_t._M_impl._4_4_ << 0x20;
    start_ss._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         start_ss._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
    _M_insert_unique<int>(&start_ss._M_t,(int *)&next_ss);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              (&local_90,&start_ss._M_t);
    get_epsilon_closure(&next_ss,(StateSet *)&local_90,nfa);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::operator=
              (&start_ss._M_t,&next_ss._M_t);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&next_ss._M_t);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_90);
    emplace_back(&ssupv,(StateSet *)&start_ss._M_t);
    iVar3 = add_state(__return_storage_ptr__);
    next_ss._M_t._M_impl._0_8_ =
         ssupv.
         super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::set<int,_std::less<int>,_std::allocator<int>_>_*,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
         .super__Head_base<0UL,_std::set<int,_std::less<int>,_std::allocator<int>_>_*,_false>.
         _M_head_impl;
    pmVar6 = std::
             map<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_int,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
             ::operator[](&ssp2s,(key_type *)&next_ss);
    *pmVar6 = iVar3;
    iVar3 = 0;
    while (i = iVar3,
          i < (int)((ulong)((long)ssupv.
                                  super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)ssupv.
                                 super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
      pvVar7 = at<std::unique_ptr<std::set<int,std::less<int>,std::allocator<int>>,std::default_delete<std::set<int,std::less<int>,std::allocator<int>>>>>
                         (&ssupv,i);
      psVar2 = (pvVar7->_M_t).
               super___uniq_ptr_impl<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::set<int,_std::less<int>,_std::allocator<int>_>_*,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               .super__Head_base<0UL,_std::set<int,_std::less<int>,_std::allocator<int>_>_*,_false>.
               _M_head_impl;
      p_Var1 = (_Rb_tree_node_base *)((long)&(psVar2->_M_t)._M_impl + 8);
      for (iVar3 = 0; iVar3 < (int)((nfa->table).ncols + (uint)nfa->is_deterministic * 2 + -2);
          iVar3 = iVar3 + 1) {
        next_ss._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        next_ss._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        next_ss._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &next_ss._M_t._M_impl.super__Rb_tree_header._M_header;
        next_ss._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        next_ss._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             next_ss._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (p_Var8 = *(_Base_ptr *)((long)&(psVar2->_M_t)._M_impl + 0x18); p_Var8 != p_Var1;
            p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
          iVar4 = step(nfa,p_Var8[1]._M_color,iVar3);
          local_c0[0] = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                        CONCAT44(local_c0[0]._4_4_,iVar4);
          if (iVar4 != -1) {
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &next_ss,(int *)local_c0);
          }
        }
        if (next_ss._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          _Rb_tree(&local_60,
                   (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   &next_ss);
          get_epsilon_closure((StateSet *)local_c0,(StateSet *)&local_60,nfa);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          operator=((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )&next_ss,
                    (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )local_c0);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )local_c0);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&local_60);
          local_c0[0] = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                        &next_ss;
          iVar9 = std::
                  _Rb_tree<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>,_std::_Select1st<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
                  ::find(&ssp2s._M_t,(key_type *)local_c0);
          if ((_Rb_tree_header *)iVar9._M_node == &ssp2s._M_t._M_impl.super__Rb_tree_header) {
            iVar4 = add_state(__return_storage_ptr__);
            emplace_back(&ssupv,&next_ss);
            local_c0[0] = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                           *)ssupv.
                             super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                             super___uniq_ptr_impl<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::set<int,_std::less<int>,_std::allocator<int>_>_*,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                             .
                             super__Head_base<0UL,_std::set<int,_std::less<int>,_std::allocator<int>_>_*,_false>
                             ._M_head_impl;
            pmVar6 = std::
                     map<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_int,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
                     ::operator[](&ssp2s,(key_type *)local_c0);
            *pmVar6 = iVar4;
          }
          else {
            iVar4 = *(int *)&iVar9._M_node[1]._M_parent;
          }
          add_transition(__return_storage_ptr__,i,iVar3,iVar4);
        }
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  &next_ss);
      }
      iVar4 = -1;
      for (p_Var8 = *(_Base_ptr *)((long)&(psVar2->_M_t)._M_impl + 0x18); p_Var8 != p_Var1;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        iVar5 = accepts(nfa,p_Var8[1]._M_color);
        iVar3 = iVar4;
        if (iVar5 < iVar4) {
          iVar3 = iVar5;
        }
        if (iVar4 == -1) {
          iVar3 = iVar5;
        }
        if (iVar5 != -1) {
          iVar4 = iVar3;
        }
      }
      iVar3 = i + 1;
      if (iVar4 != -1) {
        add_accept(__return_storage_ptr__,i,iVar4);
      }
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&start_ss._M_t);
    std::
    vector<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
    ::~vector(&ssupv);
    std::
    _Rb_tree<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>,_std::_Select1st<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
    ::~_Rb_tree(&ssp2s._M_t);
  }
  return __return_storage_ptr__;
}

Assistant:

FiniteAutomaton FiniteAutomaton::make_deterministic(
    FiniteAutomaton const& nfa) {
  if (get_determinism(nfa)) return nfa;
  StateSetPtr2State ssp2s;
  StateSetUniqPtrVector ssupv;
  FiniteAutomaton out(get_nsymbols(nfa), true, 0);
  StateSet start_ss;
  start_ss.insert(0);
  start_ss = get_epsilon_closure(start_ss, nfa);
  emplace_back(ssupv, start_ss);
  ssp2s[ssupv.back().get()] = add_state(out);
  int front = 0;
  while (front < int(ssupv.size())) {
    auto state = front;
    auto& ss = *at(ssupv, front);
    ++front;
    for (int symbol = 0; symbol < get_nsymbols(nfa); ++symbol) {
      auto next_ss = Omega_h::step(ss, symbol, nfa);
      if (next_ss.empty()) continue;
      next_ss = get_epsilon_closure(next_ss, nfa);
      int next_state;
      auto it = ssp2s.find(&next_ss);
      if (it == ssp2s.end()) {
        next_state = add_state(out);
        emplace_back(ssupv, next_ss);
        ssp2s[ssupv.back().get()] = next_state;
      } else {
        next_state = it->second;
      }
      add_transition(out, state, symbol, next_state);
    }
    int min_accepted = -1;
    for (auto nfa_state : ss) {
      auto nfa_token = accepts(nfa, nfa_state);
      if (nfa_token == -1) continue;
      if (min_accepted == -1 || nfa_token < min_accepted) {
        min_accepted = nfa_token;
      }
    }
    if (min_accepted != -1) add_accept(out, state, min_accepted);
  }
  return out;
}